

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O1

int get_param_part(OperationConfig *config,char endchar,char **str,char **pdata,char **ptype,
                  char **pfilename,char **pencoder,curl_slist **pheaders)

{
  byte bVar1;
  FILE *pFVar2;
  GlobalConfig *config_00;
  char **ppcVar3;
  int iVar4;
  uint uVar5;
  byte *pbVar6;
  size_t sVar7;
  size_t sVar8;
  byte *pbVar9;
  FILE *__stream;
  curl_slist *pcVar10;
  int *piVar11;
  char *pcVar12;
  uint uVar13;
  byte *pbVar14;
  ulong uVar15;
  curl_slist *pcVar16;
  long lVar17;
  undefined7 in_register_00000031;
  uint uVar18;
  byte *pbVar19;
  ulong uVar20;
  bool bVar21;
  char type_minor [128];
  char type_major [128];
  byte *local_588;
  byte *local_580;
  OperationConfig *local_578;
  curl_slist *local_570;
  int local_564;
  byte *local_560;
  undefined4 local_554;
  uint local_550;
  uint local_54c;
  byte *local_548;
  byte *local_540;
  byte *local_538;
  char **local_530;
  char **local_528;
  char **local_520;
  char local_518 [1256];
  
  local_554 = (undefined4)CONCAT71(in_register_00000031,endchar);
  local_588 = (byte *)*str;
  local_518[0xf0] = '\0';
  local_518[0xf1] = '\0';
  local_518[0xf2] = '\0';
  local_518[0xf3] = '\0';
  local_518[0xf4] = '\0';
  local_518[0xf5] = '\0';
  local_518[0xf6] = '\0';
  local_518[0xf7] = '\0';
  local_518[0xf8] = '\0';
  local_518[0xf9] = '\0';
  local_518[0xfa] = '\0';
  local_518[0xfb] = '\0';
  local_518[0xfc] = '\0';
  local_518[0xfd] = '\0';
  local_518[0xfe] = '\0';
  local_518[0xff] = '\0';
  local_518[0xe0] = '\0';
  local_518[0xe1] = '\0';
  local_518[0xe2] = '\0';
  local_518[0xe3] = '\0';
  local_518[0xe4] = '\0';
  local_518[0xe5] = '\0';
  local_518[0xe6] = '\0';
  local_518[0xe7] = '\0';
  local_518[0xe8] = '\0';
  local_518[0xe9] = '\0';
  local_518[0xea] = '\0';
  local_518[0xeb] = '\0';
  local_518[0xec] = '\0';
  local_518[0xed] = '\0';
  local_518[0xee] = '\0';
  local_518[0xef] = '\0';
  local_518[0xd0] = '\0';
  local_518[0xd1] = '\0';
  local_518[0xd2] = '\0';
  local_518[0xd3] = '\0';
  local_518[0xd4] = '\0';
  local_518[0xd5] = '\0';
  local_518[0xd6] = '\0';
  local_518[0xd7] = '\0';
  local_518[0xd8] = '\0';
  local_518[0xd9] = '\0';
  local_518[0xda] = '\0';
  local_518[0xdb] = '\0';
  local_518[0xdc] = '\0';
  local_518[0xdd] = '\0';
  local_518[0xde] = '\0';
  local_518[0xdf] = '\0';
  local_518[0xc0] = '\0';
  local_518[0xc1] = '\0';
  local_518[0xc2] = '\0';
  local_518[0xc3] = '\0';
  local_518[0xc4] = '\0';
  local_518[0xc5] = '\0';
  local_518[0xc6] = '\0';
  local_518[199] = '\0';
  local_518[200] = '\0';
  local_518[0xc9] = '\0';
  local_518[0xca] = '\0';
  local_518[0xcb] = '\0';
  local_518[0xcc] = '\0';
  local_518[0xcd] = '\0';
  local_518[0xce] = '\0';
  local_518[0xcf] = '\0';
  local_518[0xb0] = '\0';
  local_518[0xb1] = '\0';
  local_518[0xb2] = '\0';
  local_518[0xb3] = '\0';
  local_518[0xb4] = '\0';
  local_518[0xb5] = '\0';
  local_518[0xb6] = '\0';
  local_518[0xb7] = '\0';
  local_518[0xb8] = '\0';
  local_518[0xb9] = '\0';
  local_518[0xba] = '\0';
  local_518[0xbb] = '\0';
  local_518[0xbc] = '\0';
  local_518[0xbd] = '\0';
  local_518[0xbe] = '\0';
  local_518[0xbf] = '\0';
  local_518[0xa0] = '\0';
  local_518[0xa1] = '\0';
  local_518[0xa2] = '\0';
  local_518[0xa3] = '\0';
  local_518[0xa4] = '\0';
  local_518[0xa5] = '\0';
  local_518[0xa6] = '\0';
  local_518[0xa7] = '\0';
  local_518[0xa8] = '\0';
  local_518[0xa9] = '\0';
  local_518[0xaa] = '\0';
  local_518[0xab] = '\0';
  local_518[0xac] = '\0';
  local_518[0xad] = '\0';
  local_518[0xae] = '\0';
  local_518[0xaf] = '\0';
  local_518[0x90] = '\0';
  local_518[0x91] = '\0';
  local_518[0x92] = '\0';
  local_518[0x93] = '\0';
  local_518[0x94] = '\0';
  local_518[0x95] = '\0';
  local_518[0x96] = '\0';
  local_518[0x97] = '\0';
  local_518[0x98] = '\0';
  local_518[0x99] = '\0';
  local_518[0x9a] = '\0';
  local_518[0x9b] = '\0';
  local_518[0x9c] = '\0';
  local_518[0x9d] = '\0';
  local_518[0x9e] = '\0';
  local_518[0x9f] = '\0';
  local_518[0x80] = '\0';
  local_518[0x81] = '\0';
  local_518[0x82] = '\0';
  local_518[0x83] = '\0';
  local_518[0x84] = '\0';
  local_518[0x85] = '\0';
  local_518[0x86] = '\0';
  local_518[0x87] = '\0';
  local_518[0x88] = '\0';
  local_518[0x89] = '\0';
  local_518[0x8a] = '\0';
  local_518[0x8b] = '\0';
  local_518[0x8c] = '\0';
  local_518[0x8d] = '\0';
  local_518[0x8e] = '\0';
  local_518[0x8f] = '\0';
  local_518[0x70] = '\0';
  local_518[0x71] = '\0';
  local_518[0x72] = '\0';
  local_518[0x73] = '\0';
  local_518[0x74] = '\0';
  local_518[0x75] = '\0';
  local_518[0x76] = '\0';
  local_518[0x77] = '\0';
  local_518[0x78] = '\0';
  local_518[0x79] = '\0';
  local_518[0x7a] = '\0';
  local_518[0x7b] = '\0';
  local_518[0x7c] = '\0';
  local_518[0x7d] = '\0';
  local_518[0x7e] = '\0';
  local_518[0x7f] = '\0';
  local_518[0x60] = '\0';
  local_518[0x61] = '\0';
  local_518[0x62] = '\0';
  local_518[99] = '\0';
  local_518[100] = '\0';
  local_518[0x65] = '\0';
  local_518[0x66] = '\0';
  local_518[0x67] = '\0';
  local_518[0x68] = '\0';
  local_518[0x69] = '\0';
  local_518[0x6a] = '\0';
  local_518[0x6b] = '\0';
  local_518[0x6c] = '\0';
  local_518[0x6d] = '\0';
  local_518[0x6e] = '\0';
  local_518[0x6f] = '\0';
  local_518[0x50] = '\0';
  local_518[0x51] = '\0';
  local_518[0x52] = '\0';
  local_518[0x53] = '\0';
  local_518[0x54] = '\0';
  local_518[0x55] = '\0';
  local_518[0x56] = '\0';
  local_518[0x57] = '\0';
  local_518[0x58] = '\0';
  local_518[0x59] = '\0';
  local_518[0x5a] = '\0';
  local_518[0x5b] = '\0';
  local_518[0x5c] = '\0';
  local_518[0x5d] = '\0';
  local_518[0x5e] = '\0';
  local_518[0x5f] = '\0';
  local_518[0x40] = '\0';
  local_518[0x41] = '\0';
  local_518[0x42] = '\0';
  local_518[0x43] = '\0';
  local_518[0x44] = '\0';
  local_518[0x45] = '\0';
  local_518[0x46] = '\0';
  local_518[0x47] = '\0';
  local_518[0x48] = '\0';
  local_518[0x49] = '\0';
  local_518[0x4a] = '\0';
  local_518[0x4b] = '\0';
  local_518[0x4c] = '\0';
  local_518[0x4d] = '\0';
  local_518[0x4e] = '\0';
  local_518[0x4f] = '\0';
  local_518[0x30] = '\0';
  local_518[0x31] = '\0';
  local_518[0x32] = '\0';
  local_518[0x33] = '\0';
  local_518[0x34] = '\0';
  local_518[0x35] = '\0';
  local_518[0x36] = '\0';
  local_518[0x37] = '\0';
  local_518[0x38] = '\0';
  local_518[0x39] = '\0';
  local_518[0x3a] = '\0';
  local_518[0x3b] = '\0';
  local_518[0x3c] = '\0';
  local_518[0x3d] = '\0';
  local_518[0x3e] = '\0';
  local_518[0x3f] = '\0';
  local_518[0x20] = '\0';
  local_518[0x21] = '\0';
  local_518[0x22] = '\0';
  local_518[0x23] = '\0';
  local_518[0x24] = '\0';
  local_518[0x25] = '\0';
  local_518[0x26] = '\0';
  local_518[0x27] = '\0';
  local_518[0x28] = '\0';
  local_518[0x29] = '\0';
  local_518[0x2a] = '\0';
  local_518[0x2b] = '\0';
  local_518[0x2c] = '\0';
  local_518[0x2d] = '\0';
  local_518[0x2e] = '\0';
  local_518[0x2f] = '\0';
  local_518[0x10] = '\0';
  local_518[0x11] = '\0';
  local_518[0x12] = '\0';
  local_518[0x13] = '\0';
  local_518[0x14] = '\0';
  local_518[0x15] = '\0';
  local_518[0x16] = '\0';
  local_518[0x17] = '\0';
  local_518[0x18] = '\0';
  local_518[0x19] = '\0';
  local_518[0x1a] = '\0';
  local_518[0x1b] = '\0';
  local_518[0x1c] = '\0';
  local_518[0x1d] = '\0';
  local_518[0x1e] = '\0';
  local_518[0x1f] = '\0';
  local_518[0] = '\0';
  local_518[1] = '\0';
  local_518[2] = '\0';
  local_518[3] = '\0';
  local_518[4] = '\0';
  local_518[5] = '\0';
  local_518[6] = '\0';
  local_518[7] = '\0';
  local_518[8] = '\0';
  local_518[9] = '\0';
  local_518[10] = '\0';
  local_518[0xb] = '\0';
  local_518[0xc] = '\0';
  local_518[0xd] = '\0';
  local_518[0xe] = '\0';
  local_518[0xf] = '\0';
  if (ptype != (char **)0x0) {
    *ptype = (char *)0x0;
  }
  if (pfilename != (char **)0x0) {
    *pfilename = (char *)0x0;
  }
  if (pheaders != (curl_slist **)0x0) {
    *pheaders = (curl_slist *)0x0;
  }
  if (pencoder != (char **)0x0) {
    *pencoder = (char *)0x0;
  }
  pbVar19 = local_588 + -1;
  local_578 = config;
  local_530 = str;
  local_528 = ptype;
  do {
    pbVar6 = pbVar19 + 1;
    pbVar19 = pbVar19 + 1;
    iVar4 = Curl_isspace((uint)*pbVar6);
  } while (iVar4 != 0);
  local_564 = (int)(char)(byte)local_554;
  local_588 = pbVar19;
  pbVar6 = (byte *)get_param_word((char **)&local_588,(char **)&local_580,(byte)local_554);
  *pdata = (char *)pbVar6;
  if (pbVar19 == pbVar6) {
    while ((*pdata < local_580 && (iVar4 = Curl_isspace((uint)local_580[-1]), iVar4 != 0))) {
      local_580 = local_580 + -1;
    }
  }
  bVar1 = *local_588;
  uVar18 = (uint)bVar1;
  *local_580 = 0;
  local_520 = pfilename;
  if (bVar1 == 0x3b) {
    local_548 = (byte *)0x0;
    local_540 = (byte *)0x0;
    pbVar6 = (byte *)0x0;
    local_570 = (curl_slist *)0x0;
    pbVar14 = local_588;
    pbVar19 = (byte *)0x0;
    do {
      do {
        local_560 = pbVar19;
        pbVar9 = pbVar14;
        pbVar14 = pbVar9 + 1;
        iVar4 = Curl_isspace((uint)pbVar9[1]);
        pbVar19 = local_560;
      } while (iVar4 != 0);
      local_588 = pbVar14;
      if ((pbVar6 == (byte *)0x0) && (iVar4 = curl_strnequal("type=",pbVar14,5), iVar4 != 0)) {
        pbVar6 = pbVar9 + 6;
        do {
          pbVar19 = pbVar6;
          local_588 = pbVar19;
          iVar4 = Curl_isspace((uint)*pbVar19);
          pbVar6 = pbVar19 + 1;
        } while (iVar4 != 0);
        iVar4 = __isoc99_sscanf(pbVar19,"%127[^/ ]/%127[^;, \n]",local_518 + 0x80,local_518);
        if (iVar4 != 2) {
          warnf(local_578->global,"Illegally formatted content-type field!\n");
          pcVar16 = local_570;
LAB_0010e8b0:
          curl_slist_free_all(pcVar16);
          return -1;
        }
        sVar7 = strlen(local_518 + 0x80);
        sVar8 = strlen(local_518);
        pbVar14 = pbVar19 + 1 + sVar8 + sVar7;
        pbVar6 = pbVar14;
        while( true ) {
          bVar1 = *pbVar14;
          uVar18 = (uint)bVar1;
          if (((bVar1 == 0) || (bVar1 == 0x3b)) || (bVar1 == (byte)local_554)) break;
          local_588 = pbVar14;
          iVar4 = Curl_isspace((uint)bVar1);
          pbVar14 = pbVar14 + 1;
          if (iVar4 == 0) {
            pbVar6 = pbVar14;
          }
        }
        goto LAB_0010e359;
      }
      iVar4 = curl_strnequal("filename=",pbVar14,9);
      if (iVar4 == 0) {
        iVar4 = curl_strnequal("headers=",pbVar14,8);
        if (iVar4 == 0) {
          iVar4 = curl_strnequal("encoder=",pbVar14,8);
          if (iVar4 != 0) {
            if (pbVar6 != (byte *)0x0) {
              *pbVar6 = 0;
            }
            pbVar19 = local_588 + 7;
            do {
              pbVar6 = pbVar19 + 1;
              pbVar19 = pbVar19 + 1;
              iVar4 = Curl_isspace((uint)*pbVar6);
            } while (iVar4 != 0);
            local_588 = pbVar19;
            pbVar9 = (byte *)get_param_word((char **)&local_588,(char **)&local_580,(char)local_564)
            ;
            pbVar6 = local_580;
            pbVar14 = local_548;
            if (pbVar19 == pbVar9) {
              while ((pbVar14 = local_548, pbVar9 < pbVar6 &&
                     (iVar4 = Curl_isspace((uint)pbVar6[-1]), pbVar14 = local_548, iVar4 != 0))) {
                pbVar6 = pbVar6 + -1;
              }
            }
            goto LAB_0010e343;
          }
          bVar21 = pbVar6 == (byte *)0x0;
          pbVar6 = pbVar14;
          pbVar14 = local_588;
          if (bVar21) {
            pcVar12 = get_param_word((char **)&local_588,(char **)&local_580,(char)local_564);
            uVar18 = (uint)*local_588;
            *local_580 = 0;
            pcVar10 = local_570;
            if (*pcVar12 != '\0') {
              warnf(local_578->global,"skip unknown form field: %s\n",pcVar12);
              pcVar10 = local_570;
            }
            goto LAB_0010e352;
          }
          while( true ) {
            bVar1 = *pbVar14;
            uVar18 = (uint)bVar1;
            pbVar19 = local_560;
            if (((bVar1 == 0) || (bVar1 == 0x3b)) || (bVar1 == (byte)local_554)) break;
            iVar4 = Curl_isspace((uint)bVar1);
            pbVar14 = pbVar14 + 1;
            if (iVar4 == 0) {
              pbVar6 = pbVar14;
            }
          }
        }
        else {
          if (pbVar6 != (byte *)0x0) {
            *pbVar6 = 0;
          }
          pbVar19 = local_588 + 8;
          pbVar6 = pbVar19;
          if ((local_588[8] != 0x3c) && (local_588[8] != 0x40)) {
            pbVar6 = local_588 + 7;
            local_588 = pbVar19;
            do {
              pbVar19 = pbVar6 + 1;
              pbVar6 = pbVar6 + 1;
              iVar4 = Curl_isspace((uint)*pbVar19);
            } while (iVar4 != 0);
            local_588 = pbVar6;
            pbVar14 = (byte *)get_param_word((char **)&local_588,(char **)&local_580,(char)local_564
                                            );
            pbVar19 = local_580;
            if (pbVar6 == pbVar14) {
              while ((pbVar14 < pbVar19 && (iVar4 = Curl_isspace((uint)pbVar19[-1]), iVar4 != 0))) {
                pbVar19 = pbVar19 + -1;
              }
            }
            local_580 = pbVar19;
            pcVar16 = local_570;
            uVar18 = (uint)*local_588;
            *local_580 = 0;
            pcVar10 = (curl_slist *)curl_slist_append(local_570,pbVar14);
            if (pcVar10 == (curl_slist *)0x0) {
              curl_mfprintf(local_578->global->errors,"Out of memory for field header!\n");
              goto LAB_0010e8b0;
            }
            goto LAB_0010e352;
          }
          do {
            local_588 = pbVar6;
            pbVar6 = pbVar19 + 1;
            pbVar19 = pbVar19 + 1;
            iVar4 = Curl_isspace((uint)*pbVar6);
            pbVar6 = local_588;
          } while (iVar4 != 0);
          local_588 = pbVar19;
          pbVar14 = (byte *)get_param_word((char **)&local_588,(char **)&local_580,(char)local_564);
          pbVar6 = local_580;
          if (pbVar19 == pbVar14) {
            while ((pbVar14 < pbVar6 && (iVar4 = Curl_isspace((uint)pbVar6[-1]), iVar4 != 0))) {
              pbVar6 = pbVar6 + -1;
            }
          }
          local_580 = pbVar6;
          uVar18 = (uint)*local_588;
          *local_580 = 0;
          __stream = fopen64((char *)pbVar14,"r");
          if (__stream != (FILE *)0x0) {
            local_550 = 1;
            uVar15 = 0;
            local_538 = pbVar14;
LAB_0010e489:
            lVar17 = 0;
            uVar13 = 0;
LAB_0010e491:
            local_54c = uVar13;
            uVar5 = getc(__stream);
            if ((uVar5 != 0xffffffff) &&
               ((lVar17 != 0 || (iVar4 = Curl_isspace(uVar5 & 0xff), iVar4 != 0))))
            goto LAB_0010e4fe;
            do {
              uVar20 = uVar15;
              pcVar10 = local_570;
              if (uVar20 == 0) goto LAB_0010e4fc;
              iVar4 = Curl_isspace((uint)(byte)local_518[uVar20 + 0xff]);
              pcVar16 = local_570;
              uVar15 = uVar20 - 1;
            } while (iVar4 != 0);
            local_518[uVar20 + 0x100] = '\0';
            pcVar10 = (curl_slist *)curl_slist_append(local_570,local_518 + 0x100);
            if (pcVar10 != (curl_slist *)0x0) {
LAB_0010e4fc:
              local_570 = pcVar10;
              uVar15 = 0;
              goto LAB_0010e4fe;
            }
            bVar21 = false;
            curl_mfprintf(local_578->global->errors,"Out of memory for field headers!\n");
            goto LAB_0010e718;
          }
          config_00 = local_578->global;
          piVar11 = __errno_location();
          pcVar12 = strerror(*piVar11);
          warnf(config_00,"Cannot read from %s: %s\n",pbVar14,pcVar12);
          pcVar16 = local_570;
LAB_0010e73b:
          local_570 = pcVar16;
          pbVar6 = (byte *)0x0;
          pbVar19 = local_560;
          pbVar14 = local_588;
        }
      }
      else {
        if (pbVar6 != (byte *)0x0) {
          *pbVar6 = 0;
        }
        pbVar19 = local_588 + 8;
        do {
          pbVar6 = pbVar19 + 1;
          pbVar19 = pbVar19 + 1;
          iVar4 = Curl_isspace((uint)*pbVar6);
        } while (iVar4 != 0);
        local_588 = pbVar19;
        pbVar14 = (byte *)get_param_word((char **)&local_588,(char **)&local_580,(char)local_564);
        pbVar6 = local_580;
        pbVar9 = local_540;
        if (pbVar19 == pbVar14) {
          while ((pbVar9 = local_540, pbVar14 < pbVar6 &&
                 (iVar4 = Curl_isspace((uint)pbVar6[-1]), pbVar9 = local_540, iVar4 != 0))) {
            pbVar6 = pbVar6 + -1;
          }
        }
LAB_0010e343:
        local_540 = pbVar9;
        local_548 = pbVar14;
        local_580 = pbVar6;
        uVar18 = (uint)*local_588;
        *local_580 = 0;
        pcVar10 = local_570;
LAB_0010e352:
        local_570 = pcVar10;
        pbVar6 = (byte *)0x0;
        pbVar19 = local_560;
        pbVar14 = local_588;
      }
LAB_0010e359:
      local_588 = pbVar14;
      pbVar14 = local_588;
    } while ((char)uVar18 == ';');
  }
  else {
    local_570 = (curl_slist *)0x0;
    pbVar6 = (byte *)0x0;
    local_540 = (byte *)0x0;
    local_548 = (byte *)0x0;
    pbVar19 = (byte *)0x0;
  }
  ppcVar3 = local_520;
  pbVar14 = local_540;
  if (pbVar6 != (byte *)0x0) {
    *pbVar6 = 0;
  }
  if (local_528 == (char **)0x0) {
    if (pbVar19 != (byte *)0x0) {
      warnf(local_578->global,"Field content type not allowed here: %s\n");
    }
  }
  else {
    *local_528 = (char *)pbVar19;
  }
  pcVar16 = local_570;
  if (ppcVar3 == (char **)0x0) {
    if (local_548 != (byte *)0x0) {
      warnf(local_578->global,"Field file name not allowed here: %s\n");
    }
  }
  else {
    *ppcVar3 = (char *)local_548;
  }
  ppcVar3 = local_530;
  if (pencoder == (char **)0x0) {
    if (pbVar14 != (byte *)0x0) {
      warnf(local_578->global,"Field encoder not allowed here: %s\n",pbVar14);
    }
  }
  else {
    *pencoder = (char *)pbVar14;
  }
  if (pheaders == (curl_slist **)0x0) {
    if (pcVar16 != (curl_slist *)0x0) {
      warnf(local_578->global,"Field headers not allowed here: %s\n",pcVar16->data);
      curl_slist_free_all(pcVar16);
    }
  }
  else {
    *pheaders = pcVar16;
  }
  *ppcVar3 = (char *)local_588;
  return uVar18;
LAB_0010e4fe:
  uVar13 = local_54c;
  if (uVar5 != 0xd) {
    if (uVar5 == 0x23) {
      uVar13 = local_54c & 0xff;
      if (lVar17 == 0) {
        uVar13 = 1;
      }
    }
    else {
      if (uVar5 == 10) goto LAB_0010e58f;
      if (uVar5 == 0xffffffff) {
        iVar4 = ferror(__stream);
        bVar21 = iVar4 == 0;
        pcVar16 = local_570;
        if (!bVar21) {
          pFVar2 = local_578->global->errors;
          piVar11 = __errno_location();
          pcVar12 = strerror(*piVar11);
          curl_mfprintf(pFVar2,"Header file %s read error: %s\n",local_538,pcVar12);
          pcVar16 = local_570;
        }
LAB_0010e718:
        fclose(__stream);
        if (!bVar21) goto LAB_0010e8b0;
        goto LAB_0010e73b;
      }
    }
    lVar17 = lVar17 + 1;
    if ((uVar13 & 1) == 0) {
      if (uVar15 == 0x3e6) {
        warnf(local_578->global,"File %s line %d: header too long (truncated)\n",local_538,
              (ulong)local_550);
        uVar5 = 0x20;
      }
      if (uVar15 < 999) {
        local_518[uVar15 + 0x100] = (char)uVar5;
        uVar15 = uVar15 + 1;
      }
    }
  }
  goto LAB_0010e491;
LAB_0010e58f:
  local_550 = local_550 + 1;
  goto LAB_0010e489;
}

Assistant:

static int get_param_part(struct OperationConfig *config, char endchar,
                          char **str, char **pdata, char **ptype,
                          char **pfilename, char **pencoder,
                          struct curl_slist **pheaders)
{
  char *p = *str;
  char *type = NULL;
  char *filename = NULL;
  char *encoder = NULL;
  char *endpos;
  char *tp;
  char sep;
  char type_major[128] = "";
  char type_minor[128] = "";
  char *endct = NULL;
  struct curl_slist *headers = NULL;

  if(ptype)
    *ptype = NULL;
  if(pfilename)
    *pfilename = NULL;
  if(pheaders)
    *pheaders = NULL;
  if(pencoder)
    *pencoder = NULL;
  while(ISSPACE(*p))
    p++;
  tp = p;
  *pdata = get_param_word(&p, &endpos, endchar);
  /* If not quoted, strip trailing spaces. */
  if(*pdata == tp)
    while(endpos > *pdata && ISSPACE(endpos[-1]))
      endpos--;
  sep = *p;
  *endpos = '\0';
  while(sep == ';') {
    while(ISSPACE(*++p))
      ;

    if(!endct && checkprefix("type=", p)) {
      for(p += 5; ISSPACE(*p); p++)
        ;
      /* set type pointer */
      type = p;

      /* verify that this is a fine type specifier */
      if(2 != sscanf(type, "%127[^/ ]/%127[^;, \n]", type_major, type_minor)) {
        warnf(config->global, "Illegally formatted content-type field!\n");
        curl_slist_free_all(headers);
        return -1; /* illegal content-type syntax! */
      }

      /* now point beyond the content-type specifier */
      p = type + strlen(type_major) + strlen(type_minor) + 1;
      for(endct = p; *p && *p != ';' && *p != endchar; p++)
        if(!ISSPACE(*p))
          endct = p + 1;
      sep = *p;
    }
    else if(checkprefix("filename=", p)) {
      if(endct) {
        *endct = '\0';
        endct = NULL;
      }
      for(p += 9; ISSPACE(*p); p++)
        ;
      tp = p;
      filename = get_param_word(&p, &endpos, endchar);
      /* If not quoted, strip trailing spaces. */
      if(filename == tp)
        while(endpos > filename && ISSPACE(endpos[-1]))
          endpos--;
      sep = *p;
      *endpos = '\0';
    }
    else if(checkprefix("headers=", p)) {
      if(endct) {
        *endct = '\0';
        endct = NULL;
      }
      p += 8;
      if(*p == '@' || *p == '<') {
        char *hdrfile;
        FILE *fp;
        /* Read headers from a file. */

        do {
          p++;
        } while(ISSPACE(*p));
        tp = p;
        hdrfile = get_param_word(&p, &endpos, endchar);
        /* If not quoted, strip trailing spaces. */
        if(hdrfile == tp)
          while(endpos > hdrfile && ISSPACE(endpos[-1]))
            endpos--;
        sep = *p;
        *endpos = '\0';
        /* TODO: maybe special fopen for VMS? */
        fp = fopen(hdrfile, FOPEN_READTEXT);
        if(!fp)
          warnf(config->global, "Cannot read from %s: %s\n", hdrfile,
                strerror(errno));
        else {
          int i = read_field_headers(config, hdrfile, fp, &headers);

          fclose(fp);
          if(i) {
            curl_slist_free_all(headers);
            return -1;
          }
        }
      }
      else {
        char *hdr;

        while(ISSPACE(*p))
          p++;
        tp = p;
        hdr = get_param_word(&p, &endpos, endchar);
        /* If not quoted, strip trailing spaces. */
        if(hdr == tp)
          while(endpos > hdr && ISSPACE(endpos[-1]))
            endpos--;
        sep = *p;
        *endpos = '\0';
        if(slist_append(&headers, hdr)) {
          fprintf(config->global->errors, "Out of memory for field header!\n");
          curl_slist_free_all(headers);
          return -1;
        }
      }
    }
    else if(checkprefix("encoder=", p)) {
      if(endct) {
        *endct = '\0';
        endct = NULL;
      }
      for(p += 8; ISSPACE(*p); p++)
        ;
      tp = p;
      encoder = get_param_word(&p, &endpos, endchar);
      /* If not quoted, strip trailing spaces. */
      if(encoder == tp)
        while(endpos > encoder && ISSPACE(endpos[-1]))
          endpos--;
      sep = *p;
      *endpos = '\0';
    }
    else if(endct) {
      /* This is part of content type. */
      for(endct = p; *p && *p != ';' && *p != endchar; p++)
        if(!ISSPACE(*p))
          endct = p + 1;
      sep = *p;
    }
    else {
      /* unknown prefix, skip to next block */
      char *unknown = get_param_word(&p, &endpos, endchar);

      sep = *p;
      *endpos = '\0';
      if(*unknown)
        warnf(config->global, "skip unknown form field: %s\n", unknown);
    }
  }

  /* Terminate content type. */
  if(endct)
    *endct = '\0';

  if(ptype)
    *ptype = type;
  else if(type)
    warnf(config->global, "Field content type not allowed here: %s\n", type);

  if(pfilename)
    *pfilename = filename;
  else if(filename)
    warnf(config->global,
          "Field file name not allowed here: %s\n", filename);

  if(pencoder)
    *pencoder = encoder;
  else if(encoder)
    warnf(config->global,
          "Field encoder not allowed here: %s\n", encoder);

  if(pheaders)
    *pheaders = headers;
  else if(headers) {
    warnf(config->global,
          "Field headers not allowed here: %s\n", headers->data);
    curl_slist_free_all(headers);
  }

  *str = p;
  return sep & 0xFF;
}